

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootwindow.cpp
# Opt level: O3

Node * __thiscall RootWindow::build(RootWindow *this)

{
  pointer *pppSVar1;
  iterator __position;
  byte bVar2;
  GlyphContext *this_00;
  ostream *poVar3;
  Node *this_01;
  OpacityNode *pOVar4;
  SignalEmitter *emitter;
  Example *pEVar5;
  sockaddr *__addr;
  Button *this_02;
  LayoutNode *pLVar6;
  float extraout_XMM0_Da;
  float fVar7;
  float extraout_XMM0_Db;
  float fVar8;
  rect2d rect;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  float local_78;
  string local_68;
  float local_48;
  Units local_2c [2];
  Units units;
  
  this_00 = (GlyphContext *)operator_new(0x40);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"OpenSans-Regular.ttf","");
  rengine::GlyphContext::GlyphContext(this_00,&local_68);
  this->m_font = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
    this_00 = this->m_font;
  }
  if (this_00->m_fontData == (uchar *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to load \'",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"OpenSans-Regular.ttf",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\'...",4);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '`');
    std::ostream::put('`');
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"The font file needs to be downloaded separately and placed next",0x3f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"to the \'demo\' binary.",0x15);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (this->m_font->m_fontData == (uchar *)0x0) {
      __assert_fail("m_font->isValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/examples/rootwindow.cpp"
                    ,0x2f,"virtual Node *RootWindow::build()");
    }
  }
  (*((this->super_StandardSurface).super_Surface.m_impl)->_vptr_SurfaceBackendImpl[10])();
  local_48 = extraout_XMM0_Db;
  (*((this->super_StandardSurface).super_Surface.m_impl)->_vptr_SurfaceBackendImpl[6])();
  local_78 = extraout_XMM0_Da;
  this_01 = rengine::Node::create();
  pOVar4 = rengine::OpacityNode::create();
  this->m_appLayer = pOVar4;
  emitter = (SignalEmitter *)rengine::LayoutNode::create();
  this->m_buttonGrid = (LayoutNode *)emitter;
  bVar2 = *(byte *)((long)&emitter[5].m_buckets + 4);
  if ((bVar2 & 4) == 0) {
    *(byte *)((long)&emitter[5].m_buckets + 4) = bVar2 | 4;
    emitter = (SignalEmitter *)this->m_buttonGrid;
    bVar2 = *(byte *)((long)&emitter[5].m_buckets + 4);
  }
  if ((bVar2 & 3) != 0) {
    *(byte *)((long)&emitter[5].m_buckets + 4) = bVar2 & 0xfc;
    rengine::Signal<>::emit(&rengine::LayoutNode::onLayoutTypeChanged,emitter);
    emitter = (SignalEmitter *)this->m_buttonGrid;
  }
  fVar7 = local_48 / 25.4 + local_48 / 25.4;
  if (fVar7 <= 10.0) {
    fVar7 = 10.0;
  }
  local_48 = roundf(fVar7);
  fVar8 = local_48 * 15.0;
  fVar7 = *(float *)((long)&emitter[4].m_buckets + 4);
  if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
    *(float *)((long)&emitter[4].m_buckets + 4) = fVar8;
    rengine::Signal<>::emit(&rengine::LayoutNode::onCellWidthChanged,emitter);
    emitter = (SignalEmitter *)this->m_buttonGrid;
  }
  fVar7 = local_48 * 3.0;
  if ((*(float *)&emitter[5]._vptr_SignalEmitter != fVar7) ||
     (NAN(*(float *)&emitter[5]._vptr_SignalEmitter) || NAN(fVar7))) {
    *(float *)&emitter[5]._vptr_SignalEmitter = fVar7;
    rengine::Signal<>::emit(&rengine::LayoutNode::onCellHeightChanged,emitter);
    emitter = (SignalEmitter *)this->m_buttonGrid;
  }
  if ((*(float *)&emitter[3].m_buckets != local_48) ||
     (NAN(*(float *)&emitter[3].m_buckets) || NAN(local_48))) {
    *(float *)&emitter[3].m_buckets = local_48;
    rengine::Signal<>::emit(&rengine::LayoutNode::onSpacingChanged,emitter);
    emitter = (SignalEmitter *)this->m_buttonGrid;
  }
  fVar7 = *(float *)((long)&emitter[3]._vptr_SignalEmitter + 4);
  if ((fVar7 != local_48) || (NAN(fVar7) || NAN(local_48))) {
    *(float *)((long)&emitter[3]._vptr_SignalEmitter + 4) = local_48;
    rengine::Signal<>::emit(&rengine::LayoutNode::onMarginChanged,emitter);
    emitter = (SignalEmitter *)this->m_buttonGrid;
  }
  if (*(int *)((long)&emitter[5]._vptr_SignalEmitter + 4) != 1) {
    *(undefined4 *)((long)&emitter[5]._vptr_SignalEmitter + 4) = 1;
    rengine::Signal<>::emit(&rengine::LayoutNode::onColumnCountchanged,emitter);
    emitter = (SignalEmitter *)this->m_buttonGrid;
  }
  fVar8 = local_78 * 0.5 - *(float *)((long)&emitter[4].m_buckets + 4) * 0.5;
  fVar7 = *(float *)((long)&emitter[3].m_buckets + 4);
  if ((fVar7 != fVar8) || (NAN(fVar7) || NAN(fVar8))) {
    *(float *)((long)&emitter[3].m_buckets + 4) = fVar8;
    rengine::Signal<>::emit(&rengine::LayoutNode::onXChanged,emitter);
  }
  pEVar5 = (Example *)operator_new(0x58);
  (pEVar5->super_Node).super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  (pEVar5->super_Node).super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  (pEVar5->super_Node).m_parent = (Node *)0x0;
  (pEVar5->super_Node).m_child = (Node *)0x0;
  (pEVar5->super_Node).m_next = (Node *)0x0;
  (pEVar5->super_Node).m_prev = (Node *)0x0;
  *(undefined8 *)&(pEVar5->super_Node).field_0x30 = 0;
  pEVar5->m_window = (RootWindow *)0x0;
  (pEVar5->super_Node).super_SignalEmitter._vptr_SignalEmitter =
       (_func_int **)&PTR__Rectangles_00145870;
  pEVar5[1].super_Node.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  pEVar5[1].super_Node.super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  pEVar5[1].super_Node.m_parent = (Node *)0x0;
  add(this,pEVar5,local_2c);
  pEVar5 = (Example *)operator_new(0x50);
  (pEVar5->super_Node).super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  (pEVar5->super_Node).super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  (pEVar5->super_Node).m_parent = (Node *)0x0;
  (pEVar5->super_Node).m_child = (Node *)0x0;
  (pEVar5->super_Node).m_next = (Node *)0x0;
  (pEVar5->super_Node).m_prev = (Node *)0x0;
  *(undefined8 *)&(pEVar5->super_Node).field_0x30 = 0;
  pEVar5->m_window = (RootWindow *)0x0;
  (pEVar5->super_Node).super_SignalEmitter._vptr_SignalEmitter =
       (_func_int **)&PTR__LayeredOpacity_001458f0;
  pEVar5[1].super_Node.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  pEVar5[1].super_Node.super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  add(this,pEVar5,local_2c);
  pEVar5 = (Example *)operator_new(0x58);
  (pEVar5->super_Node).super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  (pEVar5->super_Node).super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  (pEVar5->super_Node).m_parent = (Node *)0x0;
  (pEVar5->super_Node).m_child = (Node *)0x0;
  (pEVar5->super_Node).m_next = (Node *)0x0;
  (pEVar5->super_Node).m_prev = (Node *)0x0;
  *(undefined8 *)&(pEVar5->super_Node).field_0x30 = 0;
  pEVar5->m_window = (RootWindow *)0x0;
  (pEVar5->super_Node).super_SignalEmitter._vptr_SignalEmitter =
       (_func_int **)&PTR__BlurExample_00145958;
  pEVar5[1].super_Node.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  pEVar5[1].super_Node.super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  pEVar5[1].super_Node.m_parent = (Node *)0x0;
  add(this,pEVar5,local_2c);
  pEVar5 = (Example *)operator_new(0x58);
  (pEVar5->super_Node).super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  (pEVar5->super_Node).super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  (pEVar5->super_Node).m_parent = (Node *)0x0;
  (pEVar5->super_Node).m_child = (Node *)0x0;
  (pEVar5->super_Node).m_next = (Node *)0x0;
  (pEVar5->super_Node).m_prev = (Node *)0x0;
  *(undefined8 *)&(pEVar5->super_Node).field_0x30 = 0;
  pEVar5->m_window = (RootWindow *)0x0;
  (pEVar5->super_Node).super_SignalEmitter._vptr_SignalEmitter =
       (_func_int **)&PTR__ShadowExample_00145aa0;
  pEVar5[1].super_Node.super_SignalEmitter._vptr_SignalEmitter = (_func_int **)0x0;
  pEVar5[1].super_Node.super_SignalEmitter.m_buckets =
       (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        *)0x0;
  pEVar5[1].super_Node.m_parent = (Node *)0x0;
  add(this,pEVar5,local_2c);
  rengine::LayoutEngine::updateLayout
            ((LayoutEngine *)&(this->m_buttonGrid->super_Node).field_0x34,
             &this->m_buttonGrid->super_Node);
  rengine::Node::append(this_01,&this->m_buttonGrid->super_Node);
  rengine::Node::append(this_01,&this->m_appLayer->super_Node);
  __addr = (sockaddr *)operator_new(0x28);
  local_98._8_8_ = 0;
  local_80 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/examples/rootwindow.cpp:80:70)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/examples/rootwindow.cpp:80:70)>
             ::_M_manager;
  *(undefined ***)__addr = &PTR__SignalHandler_Function_001456a8;
  local_98._M_unused._M_object = this;
  std::function<void_()>::function
            ((function<void_()> *)(__addr->sa_data + 6),(function<void_()> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  __position._M_current =
       (this->m_buttonSignalHandlers).
       super__Vector_base<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_68._M_dataplus._M_p = (pointer)__addr;
  if (__position._M_current ==
      (this->m_buttonSignalHandlers).
      super__Vector_base<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<rengine::SignalHandler<>*,std::allocator<rengine::SignalHandler<>*>>::
    _M_realloc_insert<rengine::SignalHandler<>*>
              ((vector<rengine::SignalHandler<>*,std::allocator<rengine::SignalHandler<>*>> *)
               &this->m_buttonSignalHandlers,__position,(SignalHandler<> **)&local_68);
  }
  else {
    *__position._M_current = (SignalHandler<> *)__addr;
    pppSVar1 = &(this->m_buttonSignalHandlers).
                super__Vector_base<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  this_02 = createTextButton(this,"Close",local_2c);
  this->m_closeButton = this_02;
  pLVar6 = this->m_buttonGrid;
  fVar7 = *(float *)&(pLVar6->super_Node).field_0x34;
  rect.br.x = *(float *)&pLVar6->field_0x4c + fVar7;
  rect.br.y = *(float *)&pLVar6->field_0x50 + fVar7;
  rect.tl.y = fVar7;
  rect.tl.x = fVar7;
  rengine::RectangleNodeBase::setGeometry(&this_02->super_RectangleNodeBase,rect);
  rengine::Signal<>::connect(&Button::onClicked,(int)this->m_closeButton,__addr,(socklen_t)pLVar6);
  return this_01;
}

Assistant:

Node *RootWindow::build()
{
    const char *fontFile = "OpenSans-Regular.ttf";
    m_font = new GlyphContext(fontFile);
    if (!m_font->isValid()) {
        cerr << "Failed to load '" << fontFile << "'..." << endl
             << "The font file needs to be downloaded separately and placed next" << endl
             << "to the 'demo' binary." << endl;
    }
    assert(m_font->isValid());

    Units units(this);
    vec2 windowSize = size();

    Node *root = Node::create();

    // Prepare the app layer
    m_appLayer = OpacityNode::create();


    // Prepare the button grid
    m_buttonGrid = LayoutNode::create();
    m_buttonGrid->setActivationMode(LayoutNode::Explicit);
    m_buttonGrid->setLayoutType(LayoutEngine::Grid_Horizontal);
    m_buttonGrid->setCellWidth(units.base() * 15.0f);
    m_buttonGrid->setCellHeight(units.base() * 3.0f);
    m_buttonGrid->setSpacing(units.base() * 1.0f);
    m_buttonGrid->setMargin(units.base() * 1.0f);
    m_buttonGrid->setColumnCount(1);
    m_buttonGrid->setX(windowSize.x / 2 - m_buttonGrid->cellWidth() / 2);

    add(new Rectangles(), units);
    add(new LayeredOpacity(), units);
    add(new BlurExample(), units);
    add(new ShadowExample(), units);

    m_buttonGrid->updateLayout();

    root->append(m_buttonGrid);
    root->append(m_appLayer);

    // The close button..
    SignalHandler_Function<> *handler = new SignalHandler_Function<>([this] () { closeExample(); });
    m_buttonSignalHandlers.push_back(handler);
    m_closeButton = createTextButton("Close", units);
    m_closeButton->setGeometry(rect2d::fromXywh(m_buttonGrid->margin(), m_buttonGrid->margin(),
                                                m_buttonGrid->cellWidth(), m_buttonGrid->cellHeight()));

    Button::onClicked.connect(m_closeButton, handler);

    return root;
}